

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O3

int remove_from_value_if_invalid_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  bool bVar3;
  Am_Object o;
  Am_Object obj;
  Am_Value v;
  Am_Value_List values;
  Am_Object local_78;
  Am_Object local_70;
  Am_Value local_68;
  Am_Value_List local_58;
  Am_Object *local_48;
  Am_Object local_40;
  Am_Object local_38;
  
  Am_Object::Make_Unique(self,0x169);
  Am_Value_List::Am_Value_List(&local_58);
  local_48 = self;
  pAVar2 = Am_Object::Get(self,0x169,0);
  Am_Value_List::operator=(&local_58,pAVar2);
  local_70.data = (Am_Object_Data *)0x0;
  local_78.data = (Am_Object_Data *)0x0;
  local_68.type = 0;
  local_68.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Value_List::Start(&local_58);
  bVar3 = false;
  while( true ) {
    bVar1 = Am_Value_List::Last(&local_58);
    if (bVar1) break;
    pAVar2 = Am_Value_List::Get(&local_58);
    Am_Object::operator=(&local_70,pAVar2);
    Am_Object::Am_Object(&local_38,&local_70);
    bVar1 = Am_Object_And_Owners_Valid_And_Visible(&local_38);
    Am_Object::~Am_Object(&local_38);
    if (bVar1) {
      pAVar2 = Am_Object::Get(&local_70,100,1);
      Am_Value::operator=(&local_68,pAVar2);
      pAVar2 = Am_Object::Get(&local_70,0x69,1);
      Am_Value::operator=(&local_68,pAVar2);
      Am_Object::Get_Object(&local_40,(Am_Slot_Key)&local_70,10);
      Am_Object::operator=(&local_78,&local_40);
      Am_Object::~Am_Object(&local_40);
    }
    else {
      bVar3 = true;
      Am_Value_List::Delete(&local_58,false);
    }
    Am_Value_List::Next(&local_58);
  }
  if (bVar3) {
    Am_Object::Note_Changed(local_48,0x169);
  }
  Am_Value::~Am_Value(&local_68);
  Am_Object::~Am_Object(&local_78);
  Am_Object::~Am_Object(&local_70);
  Am_Value_List::~Am_Value_List(&local_58);
  return 0;
}

Assistant:

Am_Define_Formula(int, remove_from_value_if_invalid)
{
  self.Make_Unique(Am_VALUE);
  Am_Value_List values;
  values = self.Get(Am_VALUE);
  Am_Object obj, o;
  Am_Value v;
  bool changed = false;
  for (values.Start(); !values.Last(); values.Next()) {
    obj = values.Get();
    if (!Am_Object_And_Owners_Valid_And_Visible(obj)) {
      values.Delete(false);
      changed = true;
    } else {
      //set up dependencies so this formula will be re-evaluated if
      //the object is modified
      v = obj.Peek(Am_LEFT);
      v = obj.Peek(Am_VISIBLE);
      o = obj.Get_Owner();
    }
  }
  if (changed) {
    self.Note_Changed(Am_VALUE);
  }
  return 0;
}